

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.hh
# Opt level: O0

shared_ptr<const_tchecker::parsing::clock_declaration_t> __thiscall
tchecker::parsing::system_declaration_t::get_declaration<tchecker::parsing::clock_declaration_t>
          (system_declaration_t *this,string *name,
          declaration_map_t<tchecker::parsing::clock_declaration_t> *m)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>,_true>
  in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<const_tchecker::parsing::clock_declaration_t> sVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>,_true>
  local_30;
  const_iterator it;
  declaration_map_t<tchecker::parsing::clock_declaration_t> *m_local;
  string *name_local;
  system_declaration_t *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>,_true>
               )in_RCX._M_cur;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>_>_>
       ::find(in_RCX._M_cur,(key_type *)m);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>_>_>
       ::end(it.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>,_true>
             ._M_cur);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    std::shared_ptr<const_tchecker::parsing::clock_declaration_t>::shared_ptr
              ((shared_ptr<const_tchecker::parsing::clock_declaration_t> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::clock_declaration_t>_>,_false,_true>
                           *)&local_30);
    std::shared_ptr<tchecker::parsing::clock_declaration_t_const>::
    shared_ptr<tchecker::parsing::clock_declaration_t,void>
              ((shared_ptr<tchecker::parsing::clock_declaration_t_const> *)this,&pvVar2->second);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<const_tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<const_tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<const_tchecker::parsing::clock_declaration_t>)
         sVar4.
         super___shared_ptr<const_tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<T const> get_declaration(std::string const & name, declaration_map_t<T> const & m) const
  {
    auto it = m.find(name);
    if (it == m.end())
      return nullptr;
    return it->second;
  }